

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O1

asn_dec_rval_t
SET_OF_decode_ber(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 void *ptr,size_t size,int tag_mode)

{
  ber_tlv_len_t *last_length;
  void **ppvVar1;
  asn_struct_ctx_t *opt_ctx;
  short sVar2;
  asn_TYPE_member_s *paVar3;
  int *piVar4;
  asn_dec_rval_t aVar5;
  asn_dec_rval_t aVar6;
  asn_dec_rval_t aVar7;
  undefined1 auVar8 [16];
  int iVar9;
  long lVar10;
  ssize_t sVar11;
  ulong uVar12;
  ulong extraout_RDX;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  size_t num_1;
  asn_dec_rval_t aVar16;
  ber_tlv_tag_t tlv_tag;
  asn_codec_ctx_t *local_40;
  asn_anonymous_set_ *list;
  
  paVar3 = td->elements;
  piVar4 = (int *)td->specifics;
  list = (asn_anonymous_set_ *)*struct_ptr;
  local_40 = opt_codec_ctx;
  if (list == (asn_anonymous_set_ *)0x0) {
    list = (asn_anonymous_set_ *)calloc(1,(long)*piVar4);
    *struct_ptr = list;
    if (list == (asn_anonymous_set_ *)0x0) {
      return (asn_dec_rval_t)ZEXT816(2);
    }
  }
  lVar10 = (long)piVar4[1];
  opt_ctx = (asn_struct_ctx_t *)((long)&list->array + lVar10);
  sVar2 = *(short *)((long)&list->array + lVar10);
  if (sVar2 != 2) {
    if (sVar2 == 1) {
      uVar14 = 0;
LAB_001460a5:
      ppvVar1 = &opt_ctx->ptr;
      uVar13 = 0;
      uVar15 = uVar14;
      do {
        if ((opt_ctx->step & 1) == 0) {
          uVar12 = opt_ctx->left;
          if (uVar12 == 0) {
            opt_ctx->phase = 10;
            uVar13 = 0;
LAB_00146121:
            iVar9 = 1;
            uVar15 = uVar14;
          }
          else {
            if (size < uVar12) {
              uVar12 = size;
            }
            sVar11 = ber_fetch_tag(ptr,uVar12,&tlv_tag);
            if (sVar11 == -1) {
LAB_00146104:
              uVar13 = 2;
            }
            else {
              if (sVar11 != 0) {
                uVar12 = opt_ctx->left;
                if (((long)uVar12 < 0) && (*ptr == '\0')) {
                  if (size < uVar12) {
                    uVar12 = size;
                  }
                  if (uVar12 < 2) {
                    uVar13 = 1;
                    goto LAB_00146121;
                  }
                  if (*(char *)((long)ptr + 1) != '\0') goto LAB_0014613e;
                  iVar9 = 9;
                  goto LAB_00146285;
                }
LAB_0014613e:
                if ((paVar3->tag == 0xffffffff) || (tlv_tag == paVar3->tag)) {
                  *(byte *)&opt_ctx->step = (byte)opt_ctx->step | 1;
                  goto LAB_0014615c;
                }
                ber_tlv_tag_string(tlv_tag);
                ber_tlv_tag_string(paVar3->tag);
                uVar13 = 2;
                goto LAB_00146121;
              }
              if ((-1 < opt_ctx->left) && ((ulong)opt_ctx->left <= size)) goto LAB_00146104;
              uVar13 = 1;
            }
            iVar9 = 1;
            uVar15 = uVar14;
          }
        }
        else {
LAB_0014615c:
          uVar15 = opt_ctx->left;
          if (size < (ulong)opt_ctx->left) {
            uVar15 = size;
          }
          aVar16 = (*paVar3->type->ber_decoder)(local_40,paVar3->type,ppvVar1,ptr,uVar15,0);
          if (aVar16 == (asn_dec_rval_t)0x2) {
LAB_001461f2:
            (*paVar3->type->free_struct)(paVar3->type,*ppvVar1,0);
            *ppvVar1 = (void *)0x0;
LAB_00146219:
            uVar13 = 2;
            iVar9 = 1;
            uVar15 = uVar14;
          }
          else {
            uVar13 = (ulong)(uint)aVar16;
            if (aVar16 == (asn_dec_rval_t)0x1) {
              uVar15 = opt_ctx->left;
              if ((-1 < (long)uVar15) && (uVar15 <= size)) goto LAB_001461f2;
              if (-1 < (long)uVar15) {
                opt_ctx->left = uVar15 - extraout_RDX;
              }
              ptr = (void *)((long)ptr + extraout_RDX);
              size = size - extraout_RDX;
              uVar14 = uVar14 + extraout_RDX;
              iVar9 = 1;
              uVar13 = 1;
              uVar15 = uVar14;
            }
            else {
              if (aVar16 == (asn_dec_rval_t)0x0) {
                iVar9 = asn_set_add(list,*ppvVar1);
                if (iVar9 != 0) goto LAB_00146219;
                *ppvVar1 = (void *)0x0;
                uVar13 = 0;
              }
              if (-1 < opt_ctx->left) {
                opt_ctx->left = opt_ctx->left - extraout_RDX;
              }
              ptr = (void *)((long)ptr + extraout_RDX);
              size = size - extraout_RDX;
              uVar14 = uVar14 + extraout_RDX;
              iVar9 = 0;
              uVar15 = extraout_RDX;
            }
          }
        }
LAB_00146285:
        if (iVar9 != 0) goto LAB_001462e1;
        opt_ctx->step = 0;
      } while( true );
    }
    if (sVar2 == 0) {
      last_length = &opt_ctx->left;
      aVar16 = ber_check_tags(local_40,td,opt_ctx,ptr,size,tag_mode,1,last_length,(int *)0x0);
      uVar14 = aVar16.consumed;
      if (aVar16.code != RC_OK) {
        return aVar16;
      }
      if (-1 < *last_length) {
        *last_length = *last_length + uVar14;
      }
      if (-1 < *last_length) {
        *last_length = *last_length - uVar14;
      }
      ptr = (void *)((long)ptr + uVar14);
      size = size - uVar14;
      opt_ctx->phase = opt_ctx->phase + 1;
      opt_ctx->step = 0;
      goto LAB_001460a5;
    }
    uVar15 = 0;
    goto LAB_00146302;
  }
  uVar14 = 0;
  goto LAB_001462f2;
LAB_001462e1:
  if (iVar9 != 9) {
    aVar16.consumed = uVar15;
    aVar16._0_8_ = uVar13;
    return aVar16;
  }
  opt_ctx->phase = opt_ctx->phase + 1;
  opt_ctx->step = 0;
LAB_001462f2:
  lVar10 = opt_ctx->left;
  uVar15 = uVar14;
  if (lVar10 < 0) {
    uVar15 = uVar14 + lVar10 * -2;
    lVar10 = lVar10 + 1;
    do {
      if (size < 2) {
        if ((size != 0) && (aVar6.consumed = uVar14, aVar6._0_8_ = 2, *ptr != '\0')) {
          return aVar6;
        }
        aVar7.consumed = uVar14;
        aVar7._0_8_ = 1;
        return aVar7;
      }
      if ((*ptr != '\0') || (*(char *)((long)ptr + 1) != '\0')) {
        aVar5.consumed = uVar14;
        aVar5._0_8_ = 2;
        return aVar5;
      }
      ptr = (void *)((long)ptr + 2);
      uVar14 = uVar14 + 2;
      opt_ctx->left = lVar10;
      lVar10 = lVar10 + 1;
      size = size - 2;
    } while (lVar10 != 1);
  }
  opt_ctx->phase = 10;
LAB_00146302:
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar15;
  return (asn_dec_rval_t)(auVar8 << 0x40);
}

Assistant:

asn_dec_rval_t
SET_OF_decode_ber(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const void *ptr, size_t size, int tag_mode) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;	/* Single one */

	/*
	 * Parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	ber_tlv_tag_t tlv_tag;	/* T from TLV */
	asn_dec_rval_t rval;	/* Return code from subparsers */

	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */

	ASN_DEBUG("Decoding %s as SET OF", td->name);
	
	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) {
			RETURN(RC_FAIL);
		}
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);
	
	/*
	 * Start to parse where left previously
	 */
	switch(ctx->phase) {
	case 0:
		/*
		 * PHASE 0.
		 * Check that the set of tags associated with given structure
		 * perfectly fits our expectations.
		 */

		rval = ber_check_tags(opt_codec_ctx, td, ctx, ptr, size,
			tag_mode, 1, &ctx->left, 0);
		if(rval.code != RC_OK) {
			ASN_DEBUG("%s tagging check failed: %d",
				td->name, rval.code);
			return rval;
		}

		if(ctx->left >= 0)
			ctx->left += rval.consumed; /* ?Substracted below! */
		ADVANCE(rval.consumed);

		ASN_DEBUG("Structure consumes %ld bytes, "
			"buffer %ld", (long)ctx->left, (long)size);

		NEXT_PHASE(ctx);
		/* Fall through */
	case 1:
		/*
		 * PHASE 1.
		 * From the place where we've left it previously,
		 * try to decode the next item.
		 */
	  for(;; ctx->step = 0) {
		ssize_t tag_len;	/* Length of TLV's T */

		if(ctx->step & 1)
			goto microphase2;

		/*
		 * MICROPHASE 1: Synchronize decoding.
		 */

		if(ctx->left == 0) {
			ASN_DEBUG("End of SET OF %s", td->name);
			/*
			 * No more things to decode.
			 * Exit out of here.
			 */
			PHASE_OUT(ctx);
			RETURN(RC_OK);
		}

		/*
		 * Fetch the T from TLV.
		 */
		tag_len = ber_fetch_tag(ptr, LEFT, &tlv_tag);
		switch(tag_len) {
		case 0: if(!SIZE_VIOLATION) RETURN(RC_WMORE);
			/* Fall through */
		case -1: RETURN(RC_FAIL);
		}

		if(ctx->left < 0 && ((const uint8_t *)ptr)[0] == 0) {
			if(LEFT < 2) {
				if(SIZE_VIOLATION)
					RETURN(RC_FAIL);
				else
					RETURN(RC_WMORE);
			} else if(((const uint8_t *)ptr)[1] == 0) {
				/*
				 * Found the terminator of the
				 * indefinite length structure.
				 */
				break;
			}
		}

		/* Outmost tag may be unknown and cannot be fetched/compared */
		if(elm->tag != (ber_tlv_tag_t)-1) {
		    if(BER_TAGS_EQUAL(tlv_tag, elm->tag)) {
			/*
			 * The new list member of expected type has arrived.
			 */
		    } else {
			ASN_DEBUG("Unexpected tag %s fixed SET OF %s",
				ber_tlv_tag_string(tlv_tag), td->name);
			ASN_DEBUG("%s SET OF has tag %s",
				td->name, ber_tlv_tag_string(elm->tag));
			RETURN(RC_FAIL);
		    }
		}

		/*
		 * MICROPHASE 2: Invoke the member-specific decoder.
		 */
		ctx->step |= 1;		/* Confirm entering next microphase */
	microphase2:
		
		/*
		 * Invoke the member fetch routine according to member's type
		 */
		rval = elm->type->ber_decoder(opt_codec_ctx,
				elm->type, &ctx->ptr, ptr, LEFT, 0);
		ASN_DEBUG("In %s SET OF %s code %d consumed %d",
			td->name, elm->type->name,
			rval.code, (int)rval.consumed);
		switch(rval.code) {
		case RC_OK:
			{
				asn_anonymous_set_ *list = _A_SET_FROM_VOID(st);
				if(ASN_SET_ADD(list, ctx->ptr) != 0)
					RETURN(RC_FAIL);
				else
					ctx->ptr = 0;
			}
			break;
		case RC_WMORE: /* More data expected */
			if(!SIZE_VIOLATION) {
				ADVANCE(rval.consumed);
				RETURN(RC_WMORE);
			}
			/* Fall through */
		case RC_FAIL: /* Fatal error */
			ASN_STRUCT_FREE(*elm->type, ctx->ptr);
			ctx->ptr = 0;
			RETURN(RC_FAIL);
		} /* switch(rval) */
		
		ADVANCE(rval.consumed);
	  }	/* for(all list members) */

		NEXT_PHASE(ctx);
	case 2:
		/*
		 * Read in all "end of content" TLVs.
		 */
		while(ctx->left < 0) {
			if(LEFT < 2) {
				if(LEFT > 0 && ((const char *)ptr)[0] != 0) {
					/* Unexpected tag */
					RETURN(RC_FAIL);
				} else {
					RETURN(RC_WMORE);
				}
			}
			if(((const char *)ptr)[0] == 0
			&& ((const char *)ptr)[1] == 0) {
				ADVANCE(2);
				ctx->left++;
			} else {
				RETURN(RC_FAIL);
			}
		}

		PHASE_OUT(ctx);
	}
	
	RETURN(RC_OK);
}